

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O2

void nullcDumpStackData(void)

{
  long lVar1;
  ExternTypeInfo *pEVar2;
  uint uVar3;
  ExternLocalInfo *pEVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  void *pvVar8;
  ExternVarInfo *pEVar9;
  ExternTypeInfo *pEVar10;
  char *pcVar11;
  ExternFuncInfo *pEVar12;
  int iVar13;
  ulong uVar14;
  uint arg;
  undefined8 *puVar15;
  uint *puVar16;
  uint local_49c;
  uint functionCount;
  uint variableCount;
  ExternTypeInfo *local_468;
  ExternLocalInfo *local_460;
  uint *local_458;
  ExternFuncInfo *local_450;
  ulong local_448;
  uint codeTypeCount;
  uint dataCount;
  char buf [1024];
  
  dataCount = 0xffffffff;
  pvVar8 = nullcGetVariableData(&dataCount);
  variableCount = 0;
  pEVar9 = nullcDebugVariableInfo(&variableCount);
  codeTypeCount = 0;
  pEVar10 = nullcDebugTypeInfo(&codeTypeCount);
  functionCount = 0;
  local_450 = nullcDebugFunctionInfo(&functionCount);
  local_460 = nullcDebugLocalInfo((uint *)0x0);
  pcVar11 = nullcDebugSymbols((uint *)0x0);
  nullcDebugBeginCallStack();
  local_458 = &pEVar9->offset;
  local_49c = 0;
  while (uVar5 = nullcDebugGetStackFrame(), uVar5 != 0) {
    PrintStackFrame(uVar5,buf,0x400,false);
    printf("%s",buf);
    pEVar12 = nullcDebugConvertAddressToFunction(uVar5,local_450,functionCount);
    if (pEVar12 == (ExternFuncInfo *)0x0) {
      puVar16 = local_458;
      for (uVar14 = 0; uVar14 < variableCount; uVar14 = uVar14 + 1) {
        uVar5 = puVar16[-1];
        pEVar2 = pEVar10 + uVar5;
        nullcPrintDepthIndent(1);
        printf("%p: %s %s",(ulong)*puVar16 + (long)pvVar8,pcVar11 + pEVar10[uVar5].offsetToName,
               pcVar11 + ((ExternVarInfo *)(puVar16 + -3))->offsetToName);
        if ((pEVar10[uVar5].subCat & ~CAT_POINTER) == CAT_NONE) {
          printf(" = ");
          nullcPrintBasicVariableInfo(pEVar2,(char *)((ulong)*puVar16 + (long)pvVar8));
          putchar(10);
        }
        else {
          iVar13 = strcmp(pcVar11 + pEVar2->offsetToName,"typeid");
          if (iVar13 == 0) {
            printf(" = %s\n",
                   pcVar11 + pEVar10[*(int *)((long)pvVar8 + (ulong)*puVar16)].offsetToName);
          }
          else {
            putchar(10);
            nullcPrintVariableInfo(pEVar2,(char *)((ulong)*puVar16 + (long)pvVar8),2);
          }
        }
        uVar5 = pEVar2->size + *puVar16;
        if (local_49c < uVar5) {
          local_49c = uVar5;
        }
        puVar16 = puVar16 + 4;
      }
    }
    else {
      iVar13 = 0x10 - (local_49c & 0xf);
      if ((local_49c & 0xf) == 0) {
        iVar13 = 0;
      }
      local_448 = (ulong)(iVar13 + local_49c);
      lVar1 = local_448 + (long)pvVar8;
      printf("%p: function %s(",lVar1,pcVar11 + pEVar12->offsetToName);
      for (uVar5 = 0; uVar5 < pEVar12->paramCount; uVar5 = uVar5 + 1) {
        uVar6 = pEVar12->offsetToFirstLocal + uVar5;
        printf("%s %s",pcVar11 + pEVar10[local_460[uVar6].type].offsetToName,
               pcVar11 + local_460[uVar6].offsetToName);
        if (uVar5 != pEVar12->paramCount - 1) {
          printf(", ");
        }
      }
      uVar5 = pEVar12->stackSize;
      printf(") argument size %u, stack size %u\n",(ulong)pEVar12->argumentSize);
      for (uVar6 = 0; pEVar4 = local_460, uVar6 < pEVar12->localCount; uVar6 = uVar6 + 1) {
        uVar7 = pEVar12->offsetToFirstLocal + uVar6;
        uVar3 = local_460[uVar7].type;
        local_468 = pEVar10 + uVar3;
        nullcPrintDepthIndent(1);
        printf("%p: %s %s",(ulong)pEVar4[uVar7].offset + lVar1,
               pcVar11 + pEVar10[pEVar4[uVar7].type].offsetToName);
        pEVar2 = local_468;
        if ((pEVar10[uVar3].subCat & ~CAT_POINTER) == CAT_NONE) {
          printf(" = ");
          nullcPrintBasicVariableInfo(local_468,(char *)((ulong)pEVar4[uVar7].offset + lVar1));
          putchar(10);
        }
        else {
          iVar13 = strcmp(pcVar11 + local_468->offsetToName,"typeid");
          if (iVar13 == 0) {
            printf(" = %s\n",
                   pcVar11 + pEVar10[*(int *)(lVar1 + (ulong)pEVar4[uVar7].offset)].offsetToName);
          }
          else {
            putchar(10);
            nullcPrintVariableInfo(pEVar2,(char *)((ulong)pEVar4[uVar7].offset + lVar1),2);
          }
        }
      }
      if (pEVar12->parentType != 0xffffffff) {
        puVar15 = (undefined8 *)((ulong)pEVar12->argumentSize + lVar1 + -8);
        nullcPrintDepthIndent(1);
        printf("%p: %s %s = %p\n",puVar15,"$this",
               pcVar11 + pEVar10[pEVar12->parentType].offsetToName,*puVar15);
      }
      if (pEVar12->contextType != 0xffffffff) {
        puVar15 = (undefined8 *)((ulong)pEVar12->argumentSize + lVar1 + -8);
        nullcPrintDepthIndent(1);
        printf("%p: %s %s = %p\n",puVar15,"$context",
               pcVar11 + pEVar10[pEVar12->contextType].offsetToName,*puVar15);
      }
      local_49c = (uVar5 + 0xf & 0xfffffff0) + (int)local_448;
    }
  }
  return;
}

Assistant:

void nullcDumpStackData()
{
	unsigned dataCount = ~0u;
	char *data = (char*)nullcGetVariableData(&dataCount);

	unsigned variableCount = 0;
	ExternVarInfo *codeVars = nullcDebugVariableInfo(&variableCount);

	unsigned codeTypeCount = 0;
	ExternTypeInfo *codeTypes = nullcDebugTypeInfo(&codeTypeCount);

	unsigned functionCount = 0;
	ExternFuncInfo *codeFunctions = nullcDebugFunctionInfo(&functionCount);

	ExternLocalInfo *codeLocals = nullcDebugLocalInfo(NULL);
	char *codeSymbols = nullcDebugSymbols(NULL);

	unsigned offset = 0;

	nullcDebugBeginCallStack();
	while(unsigned address = nullcDebugGetStackFrame())
	{
		char buf[1024];
		PrintStackFrame(address, buf, 1024, false);

		printf("%s", buf);

		ExternFuncInfo *func = nullcDebugConvertAddressToFunction(address, codeFunctions, functionCount);

		unsigned indent = 1;

		if(func)
		{
			ExternFuncInfo &function = *func;

			// Align offset to the first variable (by 16 byte boundary)
			int alignOffset = (offset % 16 != 0) ? (16 - (offset % 16)) : 0;
			offset += alignOffset;

			printf("%p: function %s(", (void*)(data + offset), codeSymbols + function.offsetToName);
			for(unsigned arg = 0; arg < function.paramCount; arg++)
			{
				ExternLocalInfo &lInfo = codeLocals[function.offsetToFirstLocal + arg];
				printf("%s %s", codeSymbols + codeTypes[lInfo.type].offsetToName, codeSymbols + lInfo.offsetToName);
				if(arg != function.paramCount - 1)
					printf(", ");
			}

			unsigned argumentsSize = function.argumentSize;
			unsigned stackSize = (function.stackSize + 0xf) & ~0xf;

			printf(") argument size %u, stack size %u\n", argumentsSize, stackSize);

			for(unsigned i = 0; i < function.localCount; i++)
			{
				ExternLocalInfo &lInfo = codeLocals[function.offsetToFirstLocal + i];
				ExternTypeInfo &localType = codeTypes[lInfo.type];

				nullcPrintDepthIndent(indent);
				printf("%p: %s %s", (void*)(data + offset + lInfo.offset), codeSymbols + codeTypes[lInfo.type].offsetToName, codeSymbols + lInfo.offsetToName);

				if(localType.subCat == ExternTypeInfo::CAT_NONE || localType.subCat == ExternTypeInfo::CAT_POINTER)
				{
					printf(" = ");
					nullcPrintBasicVariableInfo(localType, data + offset + lInfo.offset);
					printf("\n");
				}
				else if(strcmp(codeSymbols + localType.offsetToName, "typeid") == 0)
				{
					printf(" = %s\n", codeSymbols + codeTypes[*(int*)(data + offset + lInfo.offset)].offsetToName);
				}
				else
				{
					printf("\n");
					nullcPrintVariableInfo(localType, data + offset + lInfo.offset, indent + 1);
				}
			}

			if(function.parentType != ~0u)
			{
				char *ptr = (char*)(data + offset + function.argumentSize - NULLC_PTR_SIZE);

				nullcPrintDepthIndent(indent);
				printf("%p: %s %s = %p\n", (void*)ptr, "$this", codeSymbols + codeTypes[function.parentType].offsetToName, *(void**)ptr);
			}

			if(function.contextType != ~0u)
			{
				char *ptr = (char*)(data + offset + function.argumentSize - NULLC_PTR_SIZE);

				nullcPrintDepthIndent(indent);
				printf("%p: %s %s = %p\n", (void*)ptr, "$context", codeSymbols + codeTypes[function.contextType].offsetToName, *(void**)ptr);
			}

			offset += stackSize;
		}
		else
		{
			for(unsigned i = 0; i < variableCount; i++)
			{
				ExternTypeInfo &type = codeTypes[codeVars[i].type];

				nullcPrintDepthIndent(indent);
				printf("%p: %s %s", (void*)(data + codeVars[i].offset), codeSymbols + type.offsetToName, codeSymbols + codeVars[i].offsetToName);

				if(type.subCat == ExternTypeInfo::CAT_NONE || type.subCat == ExternTypeInfo::CAT_POINTER)
				{
					printf(" = ");
					nullcPrintBasicVariableInfo(type, data + codeVars[i].offset);
					printf("\n");
				}
				else if(strcmp(codeSymbols + type.offsetToName, "typeid") == 0)
				{
					printf(" = %s\n", codeSymbols + codeTypes[*(int*)(data + codeVars[i].offset)].offsetToName);
				}
				else
				{
					printf("\n");
					nullcPrintVariableInfo(type, data + codeVars[i].offset, indent + 1);
				}

				if(codeVars[i].offset + type.size > offset)
					offset = codeVars[i].offset + type.size;
			}
		}
	}
}